

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::CommandRunner::OnAssertExhaustionCommand
          (CommandRunner *this,AssertExhaustionCommand *command)

{
  uint32_t line_number;
  bool bVar1;
  Trap *this_00;
  undefined8 uVar2;
  bool local_91;
  string local_88;
  undefined1 local_68 [8];
  ActionResult result;
  AssertExhaustionCommand *command_local;
  CommandRunner *this_local;
  
  result.trap.root_index_ = (Index)command;
  RunAction((ActionResult *)local_68,this,
            (command->super_CommandMixin<(wabt::CommandType)10>).super_Command.line,&command->action
            ,Quiet);
  bVar1 = wabt::interp::RefPtr::operator_cast_to_bool
                    ((RefPtr *)
                     &result.values.
                      super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_91 = true;
  if (bVar1) {
    this_00 = wabt::interp::RefPtr<wabt::interp::Trap>::operator->
                        ((RefPtr<wabt::interp::Trap> *)
                         &result.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    wabt::interp::Trap::message_abi_cxx11_(&local_88,this_00);
    local_91 = std::operator!=(&local_88,"call stack exhausted");
    std::__cxx11::string::~string((string *)&local_88);
  }
  if (local_91 == false) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    line_number = *(uint32_t *)(result.trap.root_index_ + 0xc);
    uVar2 = std::__cxx11::string::c_str();
    PrintError(this,line_number,"expected trap: \"%s\"",uVar2);
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  ActionResult::~ActionResult((ActionResult *)local_68);
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result CommandRunner::OnAssertExhaustionCommand(
    const AssertExhaustionCommand* command) {
  ActionResult result =
      RunAction(command->line, &command->action, RunVerbosity::Quiet);
  if (!result.trap || result.trap->message() != "call stack exhausted") {
    PrintError(command->line, "expected trap: \"%s\"", command->text.c_str());
    return wabt::Result::Error;
  }

  // TODO: print message when assertion passes.
#if 0
  PrintError(command->line, "assert_exhaustion passed: %s",
             result.trap->message().c_str());
#endif
  return wabt::Result::Ok;
}